

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testConversion.cpp
# Opt level: O1

void testConversion(string *tempDir)

{
  float *pfVar1;
  ushort uVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  ushort uVar6;
  short sVar7;
  int iVar8;
  ostream *poVar9;
  char *pcVar10;
  Compression *pCVar11;
  ChannelList *pCVar12;
  char *pcVar13;
  Compression comp;
  char *pcVar14;
  char *pcVar15;
  int y;
  long lVar16;
  int y_6;
  long lVar17;
  int iVar18;
  int x;
  long lVar19;
  int y_7;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  OutputFile out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  FrameBuffer fb;
  Header hdr;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing conversion between pixel data types",0x2b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"individual numbers",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  anon_unknown.dwarf_b9e2c::testFloatToUint(0,0);
  anon_unknown.dwarf_b9e2c::testFloatToUint(0x3f000000,0);
  anon_unknown.dwarf_b9e2c::testFloatToUint(0xbf000000,0);
  anon_unknown.dwarf_b9e2c::testFloatToUint(0x42f82000,0x7c);
  anon_unknown.dwarf_b9e2c::testFloatToUint(0xc2f82000,0);
  anon_unknown.dwarf_b9e2c::testFloatToUint(0x58635fa9,0xffffffff);
  anon_unknown.dwarf_b9e2c::testFloatToUint(0xd8635fa9,0);
  anon_unknown.dwarf_b9e2c::testFloatToUint(0x7f800000,0xffffffff);
  anon_unknown.dwarf_b9e2c::testFloatToUint(0xff800000,0);
  anon_unknown.dwarf_b9e2c::testFloatToUint(0x7fffffff,0);
  anon_unknown.dwarf_b9e2c::testFloatToUint(0xffffffff,0);
  anon_unknown.dwarf_b9e2c::testHalfToUint(0,0);
  anon_unknown.dwarf_b9e2c::testHalfToUint(0x3800,0);
  anon_unknown.dwarf_b9e2c::testHalfToUint(0xb800,0);
  anon_unknown.dwarf_b9e2c::testHalfToUint(0x57c1,0x7c);
  anon_unknown.dwarf_b9e2c::testHalfToUint(0xd7c1,0);
  anon_unknown.dwarf_b9e2c::testHalfToUint(0x7c00,0xffffffff);
  anon_unknown.dwarf_b9e2c::testHalfToUint(0xfc00,0);
  anon_unknown.dwarf_b9e2c::testHalfToUint(0x7fff,0);
  anon_unknown.dwarf_b9e2c::testHalfToUint(0xffff,0);
  anon_unknown.dwarf_b9e2c::testFloatToHalf(0,0);
  anon_unknown.dwarf_b9e2c::testFloatToHalf(0x3f000000,0x3800);
  anon_unknown.dwarf_b9e2c::testFloatToHalf(0xbf000000,0xb800);
  anon_unknown.dwarf_b9e2c::testFloatToHalf(0x42f82000,0x57c1);
  anon_unknown.dwarf_b9e2c::testFloatToHalf(0xc2f82000,0xd7c1);
  anon_unknown.dwarf_b9e2c::testFloatToHalf(0x58635fa9,0x7c00);
  anon_unknown.dwarf_b9e2c::testFloatToHalf(0xd8635fa9,0xfc00);
  anon_unknown.dwarf_b9e2c::testFloatToHalf(0x7f800000,0x7c00);
  anon_unknown.dwarf_b9e2c::testFloatToHalf(0xff800000,0xfc00);
  anon_unknown.dwarf_b9e2c::testFloatToHalf(0x7fffffff,0x7fff);
  anon_unknown.dwarf_b9e2c::testFloatToHalf(0xffffffff,0xffff);
  anon_unknown.dwarf_b9e2c::testUintToHalf(0,0);
  anon_unknown.dwarf_b9e2c::testUintToHalf(1,0x3c00);
  anon_unknown.dwarf_b9e2c::testUintToHalf(0x7c,0x57c0);
  anon_unknown.dwarf_b9e2c::testUintToHalf(1000000,0x7c00);
  anon_unknown.dwarf_b9e2c::testUintToHalf(0xffffffff,0x7c00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"conversion of image channels while reading a file ",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  comp = NO_COMPRESSION;
  do {
    if ((comp & (DWAA_COMPRESSION|B44_COMPRESSION)) != B44_COMPRESSION) {
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0xa6dbc);
      iVar8 = 10;
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar17 = 1;
        auVar21 = _DAT_00207ae0;
        iVar18 = iVar8;
        do {
          if (SUB164(auVar21 ^ _DAT_00207af0,4) == -0x80000000 &&
              SUB164(auVar21 ^ _DAT_00207af0,0) < -0x7ffffec3) {
            *(int *)(pcVar14 + lVar17 * 4 + -4) = iVar18 + -10;
            *(int *)(pcVar14 + lVar17 * 4) = iVar18;
          }
          lVar19 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 2;
          auVar21._8_8_ = lVar19 + 2;
          iVar18 = iVar18 + 0x14;
          lVar17 = lVar17 + 2;
        } while (lVar17 != 0x13f);
        lVar16 = lVar16 + 1;
        iVar8 = iVar8 + 1;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,UINT,pcVar10,4,0x4f4,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,&fb);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,UINT,pcVar13,4,0x4f4,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar13;
      pcVar15 = pcVar10;
      do {
        lVar17 = 0;
        do {
          if (*(int *)(pcVar14 + lVar17 * 4) != *(int *)(pcVar15 + lVar17 * 4)) {
            pcVar14 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_2_5::UINT, InType = unsigned int, InTypeTag = Imf_2_5::UINT]"
            ;
            goto LAB_00136c48;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar15 = pcVar15 + 0x4f4;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0xa6dbc);
      iVar8 = 10;
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar17 = 1;
        auVar22 = _DAT_00207ae0;
        iVar18 = iVar8;
        do {
          if (SUB164(auVar22 ^ _DAT_00207af0,4) == -0x80000000 &&
              SUB164(auVar22 ^ _DAT_00207af0,0) < -0x7ffffec3) {
            *(int *)(pcVar14 + lVar17 * 4 + -4) = iVar18 + -10;
            *(int *)(pcVar14 + lVar17 * 4) = iVar18;
          }
          lVar19 = auVar22._8_8_;
          auVar22._0_8_ = auVar22._0_8_ + 2;
          auVar22._8_8_ = lVar19 + 2;
          iVar18 = iVar18 + 0x14;
          lVar17 = lVar17 + 2;
        } while (lVar17 != 0x13f);
        lVar16 = lVar16 + 1;
        iVar8 = iVar8 + 1;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,UINT,pcVar10,4,0x4f4,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,&fb);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar18 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,UINT,pcVar13,4,0x4f4,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar18 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar13;
      pcVar15 = pcVar10;
      do {
        lVar17 = 0;
        do {
          if (*(int *)(pcVar14 + lVar17 * 4) != *(int *)(pcVar15 + lVar17 * 4)) {
            pcVar14 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_2_5::UINT, InType = unsigned int, InTypeTag = Imf_2_5::UINT]"
            ;
            goto LAB_00136c67;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar15 = pcVar15 + 0x4f4;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0xa6dbc);
      iVar8 = 10;
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar17 = 1;
        auVar23 = _DAT_00207ae0;
        iVar18 = iVar8;
        do {
          if (SUB164(auVar23 ^ _DAT_00207af0,4) == -0x80000000 &&
              SUB164(auVar23 ^ _DAT_00207af0,0) < -0x7ffffec3) {
            *(int *)(pcVar14 + lVar17 * 4 + -4) = iVar18 + -10;
            *(int *)(pcVar14 + lVar17 * 4) = iVar18;
          }
          lVar19 = auVar23._8_8_;
          auVar23._0_8_ = auVar23._0_8_ + 2;
          auVar23._8_8_ = lVar19 + 2;
          iVar18 = iVar18 + 0x14;
          lVar17 = lVar17 + 2;
        } while (lVar17 != 0x13f);
        lVar16 = lVar16 + 1;
        iVar8 = iVar8 + 1;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,UINT,pcVar10,4,0x4f4,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,&fb);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0x536de);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,HALF,pcVar13,2,0x27a,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar10;
      pcVar15 = pcVar13;
      do {
        lVar17 = 0;
        do {
          fVar20 = (float)*(uint *)(pcVar14 + lVar17 * 4);
          uVar2 = *(ushort *)(pcVar15 + lVar17 * 2);
          if (*(uint *)(pcVar14 + lVar17 * 4) == 0) {
            uVar6 = (ushort)((uint)fVar20 >> 0x10);
          }
          else {
            sVar7 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar20 >> 0x17) * 2);
            if (sVar7 == 0) {
              uVar6 = half::convert((int)fVar20);
            }
            else {
              uVar6 = sVar7 + (short)(((uint)fVar20 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar20 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          fVar20 = *(float *)((long)&half::_toFloat + (ulong)uVar2 * 4);
          pfVar1 = (float *)((long)&half::_toFloat + (ulong)uVar6 * 4);
          if ((fVar20 != *pfVar1) || (NAN(fVar20) || NAN(*pfVar1))) {
            pcVar14 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_2_5::UINT, InType = half, InTypeTag = Imf_2_5::HALF]"
            ;
            goto LAB_00136c48;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar14 = pcVar14 + 0x4f4;
        pcVar15 = pcVar15 + 0x27a;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0xa6dbc);
      iVar8 = 10;
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar17 = 1;
        auVar24 = _DAT_00207ae0;
        iVar18 = iVar8;
        do {
          if (SUB164(auVar24 ^ _DAT_00207af0,4) == -0x80000000 &&
              SUB164(auVar24 ^ _DAT_00207af0,0) < -0x7ffffec3) {
            *(int *)(pcVar14 + lVar17 * 4 + -4) = iVar18 + -10;
            *(int *)(pcVar14 + lVar17 * 4) = iVar18;
          }
          lVar19 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 2;
          auVar24._8_8_ = lVar19 + 2;
          iVar18 = iVar18 + 0x14;
          lVar17 = lVar17 + 2;
        } while (lVar17 != 0x13f);
        lVar16 = lVar16 + 1;
        iVar8 = iVar8 + 1;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,UINT,pcVar10,4,0x4f4,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,&fb);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar18 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0x536de);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,HALF,pcVar13,2,0x27a,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar18 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar13;
      pcVar15 = pcVar10;
      do {
        lVar17 = 0;
        do {
          fVar20 = (float)*(uint *)(pcVar15 + lVar17 * 4);
          uVar2 = *(ushort *)(pcVar14 + lVar17 * 2);
          if (*(uint *)(pcVar15 + lVar17 * 4) == 0) {
            uVar6 = (ushort)((uint)fVar20 >> 0x10);
          }
          else {
            sVar7 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar20 >> 0x17) * 2);
            if (sVar7 == 0) {
              uVar6 = half::convert((int)fVar20);
            }
            else {
              uVar6 = sVar7 + (short)(((uint)fVar20 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar20 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          fVar20 = *(float *)((long)&half::_toFloat + (ulong)uVar2 * 4);
          pfVar1 = (float *)((long)&half::_toFloat + (ulong)uVar6 * 4);
          if ((fVar20 != *pfVar1) || (NAN(fVar20) || NAN(*pfVar1))) {
            pcVar14 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_2_5::UINT, InType = half, InTypeTag = Imf_2_5::HALF]"
            ;
            goto LAB_00136c67;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar15 = pcVar15 + 0x4f4;
        pcVar14 = pcVar14 + 0x27a;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0xa6dbc);
      iVar8 = 10;
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar17 = 1;
        auVar25 = _DAT_00207ae0;
        iVar18 = iVar8;
        do {
          if (SUB164(auVar25 ^ _DAT_00207af0,4) == -0x80000000 &&
              SUB164(auVar25 ^ _DAT_00207af0,0) < -0x7ffffec3) {
            *(int *)(pcVar14 + lVar17 * 4 + -4) = iVar18 + -10;
            *(int *)(pcVar14 + lVar17 * 4) = iVar18;
          }
          lVar19 = auVar25._8_8_;
          auVar25._0_8_ = auVar25._0_8_ + 2;
          auVar25._8_8_ = lVar19 + 2;
          iVar18 = iVar18 + 0x14;
          lVar17 = lVar17 + 2;
        } while (lVar17 != 0x13f);
        lVar16 = lVar16 + 1;
        iVar8 = iVar8 + 1;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,UINT,pcVar10,4,0x4f4,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,&fb);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,FLOAT,pcVar13,4,0x4f4,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar10;
      pcVar15 = pcVar13;
      do {
        lVar17 = 0;
        do {
          bVar5 = equivalent(*(float *)(pcVar15 + lVar17 * 4),(float)*(uint *)(pcVar14 + lVar17 * 4)
                             ,comp);
          if (!bVar5) {
            pcVar14 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_2_5::UINT, InType = float, InTypeTag = Imf_2_5::FLOAT]"
            ;
            goto LAB_00136c48;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar14 = pcVar14 + 0x4f4;
        pcVar15 = pcVar15 + 0x4f4;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0xa6dbc);
      iVar8 = 10;
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar17 = 1;
        auVar26 = _DAT_00207ae0;
        iVar18 = iVar8;
        do {
          if (SUB164(auVar26 ^ _DAT_00207af0,4) == -0x80000000 &&
              SUB164(auVar26 ^ _DAT_00207af0,0) < -0x7ffffec3) {
            *(int *)(pcVar14 + lVar17 * 4 + -4) = iVar18 + -10;
            *(int *)(pcVar14 + lVar17 * 4) = iVar18;
          }
          lVar19 = auVar26._8_8_;
          auVar26._0_8_ = auVar26._0_8_ + 2;
          auVar26._8_8_ = lVar19 + 2;
          iVar18 = iVar18 + 0x14;
          lVar17 = lVar17 + 2;
        } while (lVar17 != 0x13f);
        lVar16 = lVar16 + 1;
        iVar8 = iVar8 + 1;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,UINT,pcVar10,4,0x4f4,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,&fb);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar18 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,FLOAT,pcVar13,4,0x4f4,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar18 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar13;
      pcVar15 = pcVar10;
      do {
        lVar17 = 0;
        do {
          bVar5 = equivalent(*(float *)(pcVar14 + lVar17 * 4),(float)*(uint *)(pcVar15 + lVar17 * 4)
                             ,comp);
          if (!bVar5) {
            pcVar14 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_2_5::UINT, InType = float, InTypeTag = Imf_2_5::FLOAT]"
            ;
            goto LAB_00136c67;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar15 = pcVar15 + 0x4f4;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0x536de);
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar19 = 0;
        lVar17 = lVar16;
        do {
          fVar20 = (float)(int)lVar17;
          if (lVar17 == 0) {
            sVar7 = (short)((uint)fVar20 >> 0x10);
          }
          else {
            sVar7 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar20 >> 0x17) * 2);
            if (sVar7 == 0) {
              sVar7 = half::convert((int)fVar20);
            }
            else {
              sVar7 = sVar7 + (short)(((uint)fVar20 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar20 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          *(short *)(pcVar14 + lVar19 * 2) = sVar7;
          lVar19 = lVar19 + 1;
          lVar17 = lVar17 + 10;
        } while (lVar19 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar14 = pcVar14 + 0x27a;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,pcVar10,2,0x27a,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,&fb);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,UINT,pcVar13,4,0x4f4,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar13;
      pcVar15 = pcVar10;
      do {
        lVar17 = 0;
        do {
          if (*(int *)(pcVar14 + lVar17 * 4) !=
              (int)(long)*(float *)((long)&half::_toFloat +
                                   (ulong)*(ushort *)(pcVar15 + lVar17 * 2) * 4)) {
            pcVar14 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = half, OutTypeTag = Imf_2_5::HALF, InType = unsigned int, InTypeTag = Imf_2_5::UINT]"
            ;
            goto LAB_00136c48;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar15 = pcVar15 + 0x27a;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0x536de);
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar19 = 0;
        lVar17 = lVar16;
        do {
          fVar20 = (float)(int)lVar17;
          if (lVar17 == 0) {
            sVar7 = (short)((uint)fVar20 >> 0x10);
          }
          else {
            sVar7 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar20 >> 0x17) * 2);
            if (sVar7 == 0) {
              sVar7 = half::convert((int)fVar20);
            }
            else {
              sVar7 = sVar7 + (short)(((uint)fVar20 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar20 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          *(short *)(pcVar14 + lVar19 * 2) = sVar7;
          lVar19 = lVar19 + 1;
          lVar17 = lVar17 + 10;
        } while (lVar19 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar14 = pcVar14 + 0x27a;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,pcVar10,2,0x27a,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,&fb);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar18 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,UINT,pcVar13,4,0x4f4,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar18 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar13;
      pcVar15 = pcVar10;
      do {
        lVar17 = 0;
        do {
          if (*(int *)(pcVar14 + lVar17 * 4) !=
              (int)(long)*(float *)((long)&half::_toFloat +
                                   (ulong)*(ushort *)(pcVar15 + lVar17 * 2) * 4)) {
            pcVar14 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = half, OutTypeTag = Imf_2_5::HALF, InType = unsigned int, InTypeTag = Imf_2_5::UINT]"
            ;
            goto LAB_00136c67;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar15 = pcVar15 + 0x27a;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0x536de);
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar19 = 0;
        lVar17 = lVar16;
        do {
          fVar20 = (float)(int)lVar17;
          if (lVar17 == 0) {
            sVar7 = (short)((uint)fVar20 >> 0x10);
          }
          else {
            sVar7 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar20 >> 0x17) * 2);
            if (sVar7 == 0) {
              sVar7 = half::convert((int)fVar20);
            }
            else {
              sVar7 = sVar7 + (short)(((uint)fVar20 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar20 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          *(short *)(pcVar14 + lVar19 * 2) = sVar7;
          lVar19 = lVar19 + 1;
          lVar17 = lVar17 + 10;
        } while (lVar19 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar14 = pcVar14 + 0x27a;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,pcVar10,2,0x27a,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,&fb);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0x536de);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,HALF,pcVar13,2,0x27a,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar13;
      pcVar15 = pcVar10;
      do {
        lVar17 = 0;
        do {
          fVar20 = *(float *)((long)&half::_toFloat + (ulong)*(ushort *)(pcVar14 + lVar17 * 2) * 4);
          pfVar1 = (float *)((long)&half::_toFloat + (ulong)*(ushort *)(pcVar15 + lVar17 * 2) * 4);
          if ((fVar20 != *pfVar1) || (NAN(fVar20) || NAN(*pfVar1))) {
            pcVar14 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = half, OutTypeTag = Imf_2_5::HALF, InType = half, InTypeTag = Imf_2_5::HALF]"
            ;
            goto LAB_00136c48;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar15 = pcVar15 + 0x27a;
        pcVar14 = pcVar14 + 0x27a;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0x536de);
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar19 = 0;
        lVar17 = lVar16;
        do {
          fVar20 = (float)(int)lVar17;
          if (lVar17 == 0) {
            sVar7 = (short)((uint)fVar20 >> 0x10);
          }
          else {
            sVar7 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar20 >> 0x17) * 2);
            if (sVar7 == 0) {
              sVar7 = half::convert((int)fVar20);
            }
            else {
              sVar7 = sVar7 + (short)(((uint)fVar20 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar20 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          *(short *)(pcVar14 + lVar19 * 2) = sVar7;
          lVar19 = lVar19 + 1;
          lVar17 = lVar17 + 10;
        } while (lVar19 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar14 = pcVar14 + 0x27a;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,pcVar10,2,0x27a,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,&fb);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar18 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0x536de);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,HALF,pcVar13,2,0x27a,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar18 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar13;
      pcVar15 = pcVar10;
      do {
        lVar17 = 0;
        do {
          fVar20 = *(float *)((long)&half::_toFloat + (ulong)*(ushort *)(pcVar14 + lVar17 * 2) * 4);
          pfVar1 = (float *)((long)&half::_toFloat + (ulong)*(ushort *)(pcVar15 + lVar17 * 2) * 4);
          if ((fVar20 != *pfVar1) || (NAN(fVar20) || NAN(*pfVar1))) {
            pcVar14 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = half, OutTypeTag = Imf_2_5::HALF, InType = half, InTypeTag = Imf_2_5::HALF]"
            ;
            goto LAB_00136c67;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar15 = pcVar15 + 0x27a;
        pcVar14 = pcVar14 + 0x27a;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0x536de);
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar19 = 0;
        lVar17 = lVar16;
        do {
          fVar20 = (float)(int)lVar17;
          if (lVar17 == 0) {
            sVar7 = (short)((uint)fVar20 >> 0x10);
          }
          else {
            sVar7 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar20 >> 0x17) * 2);
            if (sVar7 == 0) {
              sVar7 = half::convert((int)fVar20);
            }
            else {
              sVar7 = sVar7 + (short)(((uint)fVar20 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar20 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          *(short *)(pcVar14 + lVar19 * 2) = sVar7;
          lVar19 = lVar19 + 1;
          lVar17 = lVar17 + 10;
        } while (lVar19 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar14 = pcVar14 + 0x27a;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,pcVar10,2,0x27a,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,&fb);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,FLOAT,pcVar13,4,0x4f4,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar13;
      pcVar15 = pcVar10;
      do {
        lVar17 = 0;
        do {
          bVar5 = equivalent(*(float *)(pcVar14 + lVar17 * 4),
                             *(float *)((long)&half::_toFloat +
                                       (ulong)*(ushort *)(pcVar15 + lVar17 * 2) * 4),comp);
          if (!bVar5) {
            pcVar14 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = half, OutTypeTag = Imf_2_5::HALF, InType = float, InTypeTag = Imf_2_5::FLOAT]"
            ;
            goto LAB_00136c48;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar15 = pcVar15 + 0x27a;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0x536de);
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar19 = 0;
        lVar17 = lVar16;
        do {
          fVar20 = (float)(int)lVar17;
          if (lVar17 == 0) {
            sVar7 = (short)((uint)fVar20 >> 0x10);
          }
          else {
            sVar7 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar20 >> 0x17) * 2);
            if (sVar7 == 0) {
              sVar7 = half::convert((int)fVar20);
            }
            else {
              sVar7 = sVar7 + (short)(((uint)fVar20 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar20 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          *(short *)(pcVar14 + lVar19 * 2) = sVar7;
          lVar19 = lVar19 + 1;
          lVar17 = lVar17 + 10;
        } while (lVar19 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar14 = pcVar14 + 0x27a;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,pcVar10,2,0x27a,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,&fb);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar18 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,FLOAT,pcVar13,4,0x4f4,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar18 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar13;
      pcVar15 = pcVar10;
      do {
        lVar17 = 0;
        do {
          bVar5 = equivalent(*(float *)(pcVar14 + lVar17 * 4),
                             *(float *)((long)&half::_toFloat +
                                       (ulong)*(ushort *)(pcVar15 + lVar17 * 2) * 4),comp);
          if (!bVar5) {
            pcVar14 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = half, OutTypeTag = Imf_2_5::HALF, InType = float, InTypeTag = Imf_2_5::FLOAT]"
            ;
            goto LAB_00136c67;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar15 = pcVar15 + 0x27a;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0xa6dbc);
      iVar8 = 10;
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar17 = 1;
        auVar27 = _DAT_00207ae0;
        iVar18 = iVar8;
        do {
          if (SUB164(auVar27 ^ _DAT_00207af0,4) == -0x80000000 &&
              SUB164(auVar27 ^ _DAT_00207af0,0) < -0x7ffffec3) {
            *(float *)(pcVar14 + lVar17 * 4 + -4) = (float)(iVar18 + -10);
            *(float *)(pcVar14 + lVar17 * 4) = (float)iVar18;
          }
          lVar19 = auVar27._8_8_;
          auVar27._0_8_ = auVar27._0_8_ + 2;
          auVar27._8_8_ = lVar19 + 2;
          iVar18 = iVar18 + 0x14;
          lVar17 = lVar17 + 2;
        } while (lVar17 != 0x13f);
        lVar16 = lVar16 + 1;
        iVar8 = iVar8 + 1;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,FLOAT,pcVar10,4,0x4f4,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,&fb);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,UINT,pcVar13,4,0x4f4,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar13;
      pcVar15 = pcVar10;
      do {
        lVar17 = 0;
        do {
          if (*(int *)(pcVar14 + lVar17 * 4) != (int)(long)*(float *)(pcVar15 + lVar17 * 4)) {
            pcVar14 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_2_5::FLOAT, InType = unsigned int, InTypeTag = Imf_2_5::UINT]"
            ;
            goto LAB_00136c48;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar15 = pcVar15 + 0x4f4;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0xa6dbc);
      iVar8 = 10;
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar17 = 1;
        auVar28 = _DAT_00207ae0;
        iVar18 = iVar8;
        do {
          if (SUB164(auVar28 ^ _DAT_00207af0,4) == -0x80000000 &&
              SUB164(auVar28 ^ _DAT_00207af0,0) < -0x7ffffec3) {
            *(float *)(pcVar14 + lVar17 * 4 + -4) = (float)(iVar18 + -10);
            *(float *)(pcVar14 + lVar17 * 4) = (float)iVar18;
          }
          lVar19 = auVar28._8_8_;
          auVar28._0_8_ = auVar28._0_8_ + 2;
          auVar28._8_8_ = lVar19 + 2;
          iVar18 = iVar18 + 0x14;
          lVar17 = lVar17 + 2;
        } while (lVar17 != 0x13f);
        lVar16 = lVar16 + 1;
        iVar8 = iVar8 + 1;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,FLOAT,pcVar10,4,0x4f4,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,&fb);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar18 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,UINT,pcVar13,4,0x4f4,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar18 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar13;
      pcVar15 = pcVar10;
      do {
        lVar17 = 0;
        do {
          if (*(int *)(pcVar14 + lVar17 * 4) != (int)(long)*(float *)(pcVar15 + lVar17 * 4)) {
            pcVar14 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_2_5::FLOAT, InType = unsigned int, InTypeTag = Imf_2_5::UINT]"
            ;
            goto LAB_00136c67;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar15 = pcVar15 + 0x4f4;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0xa6dbc);
      iVar8 = 10;
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar17 = 1;
        auVar29 = _DAT_00207ae0;
        iVar18 = iVar8;
        do {
          if (SUB164(auVar29 ^ _DAT_00207af0,4) == -0x80000000 &&
              SUB164(auVar29 ^ _DAT_00207af0,0) < -0x7ffffec3) {
            *(float *)(pcVar14 + lVar17 * 4 + -4) = (float)(iVar18 + -10);
            *(float *)(pcVar14 + lVar17 * 4) = (float)iVar18;
          }
          lVar19 = auVar29._8_8_;
          auVar29._0_8_ = auVar29._0_8_ + 2;
          auVar29._8_8_ = lVar19 + 2;
          iVar18 = iVar18 + 0x14;
          lVar17 = lVar17 + 2;
        } while (lVar17 != 0x13f);
        lVar16 = lVar16 + 1;
        iVar8 = iVar8 + 1;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,FLOAT,pcVar10,4,0x4f4,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,&fb);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0x536de);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,HALF,pcVar13,2,0x27a,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar10;
      pcVar15 = pcVar13;
      do {
        lVar17 = 0;
        do {
          uVar2 = *(ushort *)(pcVar15 + lVar17 * 2);
          fVar20 = *(float *)(pcVar14 + lVar17 * 4);
          if ((fVar20 != 0.0) || (NAN(fVar20))) {
            sVar7 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar20 >> 0x17) * 2);
            if (sVar7 == 0) {
              uVar6 = half::convert((int)fVar20);
            }
            else {
              uVar6 = sVar7 + (short)(((uint)fVar20 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar20 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar6 = (ushort)((uint)fVar20 >> 0x10);
          }
          fVar20 = *(float *)((long)&half::_toFloat + (ulong)uVar2 * 4);
          pfVar1 = (float *)((long)&half::_toFloat + (ulong)uVar6 * 4);
          if ((fVar20 != *pfVar1) || (NAN(fVar20) || NAN(*pfVar1))) {
            pcVar14 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_2_5::FLOAT, InType = half, InTypeTag = Imf_2_5::HALF]"
            ;
            goto LAB_00136c48;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar14 = pcVar14 + 0x4f4;
        pcVar15 = pcVar15 + 0x27a;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0xa6dbc);
      iVar8 = 10;
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar17 = 1;
        auVar30 = _DAT_00207ae0;
        iVar18 = iVar8;
        do {
          if (SUB164(auVar30 ^ _DAT_00207af0,4) == -0x80000000 &&
              SUB164(auVar30 ^ _DAT_00207af0,0) < -0x7ffffec3) {
            *(float *)(pcVar14 + lVar17 * 4 + -4) = (float)(iVar18 + -10);
            *(float *)(pcVar14 + lVar17 * 4) = (float)iVar18;
          }
          lVar19 = auVar30._8_8_;
          auVar30._0_8_ = auVar30._0_8_ + 2;
          auVar30._8_8_ = lVar19 + 2;
          iVar18 = iVar18 + 0x14;
          lVar17 = lVar17 + 2;
        } while (lVar17 != 0x13f);
        lVar16 = lVar16 + 1;
        iVar8 = iVar8 + 1;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,FLOAT,pcVar10,4,0x4f4,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,&fb);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar18 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0x536de);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,HALF,pcVar13,2,0x27a,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar18 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar13;
      pcVar15 = pcVar10;
      do {
        lVar17 = 0;
        do {
          uVar2 = *(ushort *)(pcVar14 + lVar17 * 2);
          fVar20 = *(float *)(pcVar15 + lVar17 * 4);
          if ((fVar20 != 0.0) || (NAN(fVar20))) {
            sVar7 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar20 >> 0x17) * 2);
            if (sVar7 == 0) {
              uVar6 = half::convert((int)fVar20);
            }
            else {
              uVar6 = sVar7 + (short)(((uint)fVar20 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar20 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar6 = (ushort)((uint)fVar20 >> 0x10);
          }
          fVar20 = *(float *)((long)&half::_toFloat + (ulong)uVar2 * 4);
          pfVar1 = (float *)((long)&half::_toFloat + (ulong)uVar6 * 4);
          if ((fVar20 != *pfVar1) || (NAN(fVar20) || NAN(*pfVar1))) {
            pcVar14 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_2_5::FLOAT, InType = half, InTypeTag = Imf_2_5::HALF]"
            ;
            goto LAB_00136c67;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar15 = pcVar15 + 0x4f4;
        pcVar14 = pcVar14 + 0x27a;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0xa6dbc);
      iVar8 = 10;
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar17 = 1;
        auVar31 = _DAT_00207ae0;
        iVar18 = iVar8;
        do {
          if (SUB164(auVar31 ^ _DAT_00207af0,4) == -0x80000000 &&
              SUB164(auVar31 ^ _DAT_00207af0,0) < -0x7ffffec3) {
            *(float *)(pcVar14 + lVar17 * 4 + -4) = (float)(iVar18 + -10);
            *(float *)(pcVar14 + lVar17 * 4) = (float)iVar18;
          }
          lVar19 = auVar31._8_8_;
          auVar31._0_8_ = auVar31._0_8_ + 2;
          auVar31._8_8_ = lVar19 + 2;
          iVar18 = iVar18 + 0x14;
          lVar17 = lVar17 + 2;
        } while (lVar17 != 0x13f);
        lVar16 = lVar16 + 1;
        iVar8 = iVar8 + 1;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,FLOAT,pcVar10,4,0x4f4,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,&fb);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,FLOAT,pcVar13,4,0x4f4,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar10;
      pcVar15 = pcVar13;
      do {
        lVar17 = 0;
        do {
          bVar5 = equivalent(*(float *)(pcVar15 + lVar17 * 4),*(float *)(pcVar14 + lVar17 * 4),comp)
          ;
          if (!bVar5) {
            pcVar14 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_2_5::FLOAT, InType = float, InTypeTag = Imf_2_5::FLOAT]"
            ;
LAB_00136c48:
            __assert_fail("isEquivalent (inPixels[y][x], InType (outPixels[y][x]), compression)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testConversion.cpp"
                          ,0xea,pcVar14);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar14 = pcVar14 + 0x4f4;
        pcVar15 = pcVar15 + 0x4f4;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      _Var4 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"output type ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"input type ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n    ",6);
      std::ostream::flush();
      pcVar10 = (char *)operator_new__(0xa6dbc);
      iVar8 = 10;
      lVar16 = 0;
      pcVar14 = pcVar10;
      do {
        lVar17 = 1;
        auVar32 = _DAT_00207ae0;
        iVar18 = iVar8;
        do {
          if (SUB164(auVar32 ^ _DAT_00207af0,4) == -0x80000000 &&
              SUB164(auVar32 ^ _DAT_00207af0,0) < -0x7ffffec3) {
            *(float *)(pcVar14 + lVar17 * 4 + -4) = (float)(iVar18 + -10);
            *(float *)(pcVar14 + lVar17 * 4) = (float)iVar18;
          }
          lVar19 = auVar32._8_8_;
          auVar32._0_8_ = auVar32._0_8_ + 2;
          auVar32._8_8_ = lVar19 + 2;
          iVar18 = iVar18 + 0x14;
          lVar17 = lVar17 + 2;
        } while (lVar17 != 0x13f);
        lVar16 = lVar16 + 1;
        iVar8 = iVar8 + 1;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = comp;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,FLOAT,pcVar10,4,0x4f4,1,1,0.0,false,
                 SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"X",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var4._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,&fb);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar18 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      Imf_2_5::Header::~Header(&hdr);
      pcVar13 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,FLOAT,pcVar13,4,0x4f4,1,1,0.0,false,(bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var4._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar18 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar18 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar16 = 0;
      pcVar14 = pcVar13;
      pcVar15 = pcVar10;
      do {
        lVar17 = 0;
        do {
          bVar5 = equivalent(*(float *)(pcVar14 + lVar17 * 4),*(float *)(pcVar15 + lVar17 * 4),comp)
          ;
          if (!bVar5) {
            pcVar14 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_2_5::FLOAT, InType = float, InTypeTag = Imf_2_5::FLOAT]"
            ;
LAB_00136c67:
            __assert_fail("isEquivalent (inPixels[y][x], InType (outPixels[y][x]), compression)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testConversion.cpp"
                          ,0x139,pcVar14);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x13d);
        lVar16 = lVar16 + 1;
        pcVar15 = pcVar15 + 0x4f4;
        pcVar14 = pcVar14 + 0x4f4;
      } while (lVar16 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      remove(_Var4._M_p);
      operator_delete__(pcVar13);
      operator_delete__(pcVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
    }
    comp = comp + RLE_COMPRESSION;
    if (comp == NUM_COMPRESSION_METHODS) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      return;
    }
  } while( true );
}

Assistant:

void
testConversion (const std::string &tempDir)
{
    try
    {
	cout << "Testing conversion between pixel data types" << endl;

	cout << "individual numbers" << endl;

	testNumbers();

	cout << "conversion of image channels while reading a file " << endl;

	for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
	{
	    if (comp == B44_COMPRESSION ||
                comp == B44A_COMPRESSION)
            {
		continue;
            }

	    testImageChannel <unsigned int, IMF::UINT, unsigned int, IMF::UINT>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	    testImageChannel <unsigned int, IMF::UINT, half, IMF::HALF>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	    testImageChannel <unsigned int, IMF::UINT, float, IMF::FLOAT>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	    testImageChannel <half, IMF::HALF, unsigned int, IMF::UINT>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	    testImageChannel <half, IMF::HALF, half, IMF::HALF>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	    testImageChannel <half, IMF::HALF, float, IMF::FLOAT>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	    testImageChannel <float, IMF::FLOAT, unsigned int, IMF::UINT>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	    testImageChannel <float, IMF::FLOAT, half, IMF::HALF>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	    testImageChannel <float, IMF::FLOAT, float, IMF::FLOAT>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	}
	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}